

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.h
# Opt level: O0

void __thiscall
JsUtil::WeaklyReferencedKeyDictionary<Js::Type,_bool,_DefaultComparer<const_Js::Type_*>,_true>::
Initialize(WeaklyReferencedKeyDictionary<Js::Type,_bool,_DefaultComparer<const_Js::Type_*>,_true>
           *this,int capacity)

{
  Recycler *pRVar1;
  int local_a4;
  int i;
  TrackAllocData local_90;
  WeakRefDictionaryEntry<Js::Type,_bool> *local_68;
  EntryType *entries;
  undefined8 local_58;
  TrackAllocData local_50;
  int *local_28;
  int *buckets;
  int local_18;
  int size;
  int modIndex;
  int capacity_local;
  WeaklyReferencedKeyDictionary<Js::Type,_bool,_DefaultComparer<const_Js::Type_*>,_true> *this_local
  ;
  
  local_18 = 0x4b;
  size = capacity;
  _modIndex = this;
  buckets._4_4_ = PrimePolicy::GetSize(capacity,&local_18);
  pRVar1 = this->recycler;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&int::typeinfo,0,(long)(int)buckets._4_4_,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/Dictionary.h"
             ,0x1bd);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_50);
  entries = (EntryType *)Memory::Recycler::AllocLeaf;
  local_58 = 0;
  local_28 = Memory::AllocateArray<Memory::Recycler,int,false>
                       ((Memory *)pRVar1,(Recycler *)Memory::Recycler::AllocLeaf,0,
                        (long)(int)buckets._4_4_);
  pRVar1 = this->recycler;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_90,(type_info *)&WeakRefDictionaryEntry<Js::Type,bool>::typeinfo,0,
             (long)(int)buckets._4_4_,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/Dictionary.h"
             ,0x1be);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_90);
  local_68 = Memory::
             AllocateArray<Memory::Recycler,JsUtil::WeakRefDictionaryEntry<Js::Type,bool>,false>
                       ((Memory *)pRVar1,(Recycler *)Memory::Recycler::Alloc,0,
                        (long)(int)buckets._4_4_);
  if ((local_28 != (int *)0x0) && (local_68 != (WeakRefDictionaryEntry<Js::Type,_bool> *)0x0)) {
    this->size = buckets._4_4_;
    Memory::WriteBarrierPtr<int>::operator=(&this->buckets,local_28);
    for (local_a4 = 0; local_a4 < (int)buckets._4_4_; local_a4 = local_a4 + 1) {
      local_28[local_a4] = -1;
    }
    Memory::WriteBarrierPtr<JsUtil::WeakRefDictionaryEntry<Js::Type,_bool>_>::operator=
              (&this->entries,local_68);
    this->freeList = -1;
    this->modFunctionIndex = local_18;
  }
  return;
}

Assistant:

void Initialize(int capacity)
        {
            int modIndex = UNKNOWN_MOD_INDEX;
            int size = PrimePolicy::GetSize(capacity, &modIndex);

            int* buckets = RecyclerNewArrayLeaf(recycler, int, size);
            EntryType * entries = RecyclerNewArray(recycler, EntryType, size);

            // No need for auto pointers here since these are both recycler
            // allocated objects
            if (buckets != nullptr && entries != nullptr)
            {
                this->size = size;
                this->buckets = buckets;
                for (int i = 0; i < size; i++) buckets[i] = -1;
                this->entries = entries;
                this->freeList = -1;
                this->modFunctionIndex = modIndex;
            }
        }